

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_extswsli1(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  tcg_gen_ext32s_i64_ppc64(tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)))
  ;
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,(ulong)(uVar1 >> 0xb & 0x1f) | 0x20);
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,ret);
  return;
}

Assistant:

static void gen_extswsli1(DisasContext *ctx)
{
    gen_extswsli(ctx, 1);
}